

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O0

void test_readers_writers_with_handle_pool
               (int nhandles,int nfiles,int writers,int readers,bool useSnapHandlePool,int time)

{
  undefined1 auVar1 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong uVar3;
  long lVar4;
  undefined8 uVar5;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  char *pcVar6;
  byte in_R8B;
  int in_R9D;
  string test_title;
  int r_1;
  int j;
  int i_2;
  int i_1;
  int threadid;
  ops_args oa;
  pthread_t *threads;
  FileHandlePool *hp;
  string filename;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  char *in_stack_fffffffffffffcf8;
  FILE *pFVar7;
  FileHandlePool *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  int count;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  SnapHandlePool *in_stack_fffffffffffffd50;
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [12];
  int in_stack_fffffffffffffe74;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe78;
  FileHandlePool *in_stack_fffffffffffffe80;
  string local_178 [36];
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  float local_138;
  byte local_134;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  undefined1 local_121;
  undefined1 local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  undefined4 local_e0;
  string local_d0 [32];
  string local_b0 [36];
  int local_8c;
  int local_6c;
  __time_t local_48;
  __suseconds_t local_40;
  timeval local_28;
  int local_18;
  byte local_11;
  uint local_10;
  uint local_c;
  uint local_8;
  
  local_11 = in_R8B & 1;
  local_18 = in_R9D;
  local_10 = in_ECX;
  local_c = in_EDX;
  local_8 = in_ESI;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  local_48 = local_28.tv_sec;
  local_40 = local_28.tv_usec;
  memleak_start();
  local_6c = system("rm -rf  usecase_test* > errorlog.txt");
  if ((int)local_8 < 1) {
    fprintf(_stderr,"[ERROR] Invalid number of files: %d!",(ulong)local_8);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x10539b);
    for (local_8c = 1; count = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20),
        local_8c <= (int)local_8; local_8c = local_8c + 1) {
      std::__cxx11::to_string(in_stack_fffffffffffffd4c);
      std::operator+((char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd00);
      std::__cxx11::string::~string(local_d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd10,
                  (value_type *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::__cxx11::string::~string(local_b0);
    }
    if ((int)(local_c + local_10) < 1) {
      fprintf(_stderr,"[ERROR] Invalid number of readers (%d)/writers (%d)!",(ulong)local_10,
              (ulong)local_c);
      local_e0 = 1;
    }
    else {
      if ((local_11 & 1) == 0) {
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 operator_new(0x58);
        local_101 = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd50,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        FileHandlePool::FileHandlePool
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
        local_101 = 0;
        local_e8 = pbVar2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd10);
      }
      else {
        in_stack_fffffffffffffd38 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x98)
        ;
        local_121 = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd50,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        SnapHandlePool::SnapHandlePool
                  (in_stack_fffffffffffffd50,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),count);
        local_121 = 0;
        local_e8 = in_stack_fffffffffffffd38;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd10);
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(int)(local_c + local_10);
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new__(uVar3);
      local_140 = local_e8;
      local_138 = (float)local_18;
      local_134 = local_11 & 1;
      local_144 = 0;
      local_130 = pbVar2;
      for (local_148 = 0; local_148 < (int)local_c; local_148 = local_148 + 1) {
        lVar4 = (long)local_144;
        local_144 = local_144 + 1;
        pthread_create((pthread_t *)(local_130 + lVar4 * 8),(pthread_attr_t *)0x0,invoke_writer_ops,
                       &local_140);
      }
      for (local_14c = 0; local_14c < (int)local_10; local_14c = local_14c + 1) {
        lVar4 = (long)local_144;
        local_144 = local_144 + 1;
        pthread_create((pthread_t *)(local_130 + lVar4 * 8),(pthread_attr_t *)0x0,invoke_reader_ops,
                       &local_140);
      }
      if (local_144 != local_10 + local_c) {
        __assert_fail("threadid == readers + writers",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                      ,0x288,
                      "void test_readers_writers_with_handle_pool(int, int, int, int, bool, int)");
      }
      for (local_150 = 0; local_150 < (int)(local_10 + local_c); local_150 = local_150 + 1) {
        local_154 = pthread_join(*(pthread_t *)(local_130 + (long)local_150 * 8),(void **)0x0);
        if (local_154 != 0) {
          __assert_fail("r == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                        ,0x28d,
                        "void test_readers_writers_with_handle_pool(int, int, int, int, bool, int)")
          ;
        }
        local_154 = 0;
      }
      if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete__(local_130);
      }
      std::__cxx11::to_string(in_stack_fffffffffffffd4c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                     (char *)in_stack_fffffffffffffd00);
      std::__cxx11::to_string(in_stack_fffffffffffffd4c);
      std::operator+(in_stack_fffffffffffffd38,pbVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                     (char *)in_stack_fffffffffffffd00);
      std::__cxx11::to_string(in_stack_fffffffffffffd4c);
      std::operator+(in_stack_fffffffffffffd38,pbVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                     (char *)in_stack_fffffffffffffd00);
      std::__cxx11::to_string(in_stack_fffffffffffffd4c);
      std::operator+(in_stack_fffffffffffffd38,pbVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                     (char *)in_stack_fffffffffffffd00);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd48);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_258);
      pcVar6 = "Shared Pool test";
      if ((local_11 & 1) != 0) {
        pcVar6 = "Seperate Pool test";
      }
      std::__cxx11::string::operator+=(local_178,pcVar6);
      std::__cxx11::string::c_str();
      FileHandlePool::displayCollection(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      in_stack_fffffffffffffd10 = local_e8;
      if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e8 + 8))();
      }
      fdb_shutdown();
      local_6c = system("rm -rf  usecase_test* > errorlog.txt");
      memleak_end();
      if (test_readers_writers_with_handle_pool::__test_pass == 0) {
        pFVar7 = _stderr;
        uVar5 = std::__cxx11::string::c_str();
        fprintf(pFVar7,"%s FAILED\n",uVar5);
      }
      else {
        pFVar7 = _stderr;
        uVar5 = std::__cxx11::string::c_str();
        fprintf(pFVar7,"%s PASSED\n",uVar5);
      }
      std::__cxx11::string::~string(local_178);
      local_e0 = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd10);
  }
  return;
}

Assistant:

void test_readers_writers_with_handle_pool(int nhandles,
                                           int nfiles,
                                           int writers,
                                           int readers,
                                           bool useSnapHandlePool,
                                           int time) {
    TEST_INIT();
    memleak_start();

    int r;

    r = system(SHELL_DEL" usecase_test* > errorlog.txt");
    (void)r;

    if (nfiles < 1) {
        fprintf(stderr, "[ERROR] Invalid number of files: %d!", nfiles);
        return;
    }

    // Set filename(s)
    std::vector<std::string> files;
    for (int i = 1; i <= nfiles; ++i) {
        std::string filename("./usecase_test" + std::to_string(i));
        files.push_back(filename);
    }

    if (writers + readers < 1) {
        fprintf(stderr, "[ERROR] Invalid number of readers (%d)/writers (%d)!",
                readers, writers);
        return;
    }

    // Prepare handle pool
    FileHandlePool *hp;
    if (!useSnapHandlePool) {
        hp = new FileHandlePool(files, nhandles);
    } else {
        hp = new SnapHandlePool(files, nhandles);
    }

    thread_t *threads = new thread_t[writers + readers];

    struct ops_args oa{hp, (float)time, useSnapHandlePool};

    int threadid = 0;
    // Spawn writer thread(s)
    for (int i = 0; i < writers; ++i) {
        thread_create(&threads[threadid++], invoke_writer_ops, &oa);
    }

    // Spawn reader thread(s)
    for (int i = 0; i < readers; ++i) {
        thread_create(&threads[threadid++], invoke_reader_ops, &oa);
    }

    assert(threadid == readers + writers);

    // Wait for child threads
    for (int j = 0; j < (readers + writers); ++j) {
        int r = thread_join(threads[j], nullptr);
        assert(r == 0);
    }
    delete[] threads;

    std::string test_title(std::to_string(nhandles) + "H, " +
                           std::to_string(nfiles) + "F, " +
                           std::to_string(writers) + "RW, " +
                           std::to_string(readers) + "RO - ");
    test_title += useSnapHandlePool ? "Seperate Pool test" : "Shared Pool test";

    /* Print Collected Stats */
    hp->displayCollection(test_title.c_str());

#ifdef __DEBUG_USECASE
    hp->printHandleStats();
#endif

    /* cleanup */
    delete hp;

    /* shutdown */
    fdb_shutdown();

#ifndef __DEBUG_USECASE
    r = system(SHELL_DEL" usecase_test* > errorlog.txt");
    (void)r;
#endif

    memleak_end();
    TEST_RESULT(test_title.c_str());
}